

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ImVec2 in_RAX;
  ImDrawList *this;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  int n;
  char *pcVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ImVec2 local_38;
  
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
    return;
  }
  bVar9 = window->WasActive;
  pIVar6 = GImGui->NavWindow;
  local_38 = in_RAX;
  if (bVar9 == false) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
    pcVar13 = " *Inactive*";
  }
  else {
    pcVar13 = "";
  }
  bVar7 = TreeNodeEx(label,(uint)(pIVar6 == window),"%s \'%s\'%s",label,window->Name,pcVar13);
  if (bVar9 == false) {
    PopStyleColor(1);
  }
  bVar8 = IsItemHovered(0);
  if ((bVar8 & bVar9) == 1) {
    this = GetForegroundDrawList();
    local_38.x = (window->Size).x + (window->Pos).x;
    local_38.y = (window->Size).y + (window->Pos).y;
    ImDrawList::AddRect(this,&window->Pos,&local_38,0xff00ffff,0.0,0xf,1.0);
  }
  if (!bVar7) {
    return;
  }
  if (window->MemoryCompacted == true) {
    TextDisabled("Note: some memory buffers have been compacted/freed.");
  }
  uVar5 = window->Flags;
  DebugNodeDrawList(window,window->DrawList,"DrawList");
  BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
             (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
             (double)(window->Size).y,(double)(window->ContentSize).x,
             (double)(window->ContentSize).y,(double)(window->ContentSizeIdeal).x,
             (double)(window->ContentSizeIdeal).y);
  pcVar13 = "Child ";
  if ((uVar5 >> 0x18 & 1) == 0) {
    pcVar13 = "";
  }
  auVar23._0_4_ = -(uint)((uVar5 & 0x10000000) == 0);
  auVar23._4_4_ = -(uint)((uVar5 & 0x8000000) == 0);
  auVar23._8_4_ = -(uint)((uVar5 & 0x4000000) == 0);
  auVar23._12_4_ = -(uint)((uVar5 & 0x2000000) == 0);
  auVar22._0_4_ = -(uint)((uVar5 & 0x40) == 0);
  auVar22._4_4_ = -(uint)((uVar5 & 0x40000) == 0);
  auVar22._8_4_ = -(uint)((uVar5 & 0x200) == 0);
  auVar22._12_4_ = -(uint)((uVar5 & 0x100) == 0);
  auVar23 = packssdw(auVar22,auVar23);
  auVar23 = packsswb(auVar23,auVar23);
  pcVar10 = "Tooltip ";
  if ((auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar10 = "";
  }
  pcVar11 = "Popup ";
  if ((auVar23 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar11 = "";
  }
  pcVar14 = "Modal ";
  if ((auVar23 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar14 = "";
  }
  pcVar15 = "ChildMenu ";
  if ((auVar23 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar15 = "";
  }
  pcVar16 = "NoSavedSettings ";
  if ((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar16 = "";
  }
  pcVar20 = "NoMouseInputs";
  if ((auVar23 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar20 = "";
  }
  pcVar17 = "NoNavInputs";
  if ((auVar23 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar17 = "";
  }
  pcVar18 = "AlwaysAutoResize";
  if ((auVar23 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar18 = "";
  }
  BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar5,pcVar13,pcVar10,pcVar11,pcVar14,
             pcVar15,pcVar16,pcVar20,pcVar17,pcVar18);
  pcVar13 = "X";
  if (window->ScrollbarX == false) {
    pcVar13 = "";
  }
  pcVar10 = "Y";
  if (window->ScrollbarY == false) {
    pcVar10 = "";
  }
  BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
             (double)(window->ScrollMax).x,(double)(window->Scroll).y,(double)(window->ScrollMax).y,
             pcVar13,pcVar10);
  if ((window->Active == false) && (window->WasActive == false)) {
    uVar12 = 0xffffffffffffffff;
  }
  else {
    uVar12 = (ulong)(uint)(int)window->BeginOrderWithinContext;
  }
  BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",(ulong)window->Active,
             (ulong)window->WasActive,(ulong)window->WriteAccessed,uVar12);
  BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
             (ulong)window->Appearing,(ulong)window->Hidden,
             (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
             (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
  BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
             (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
  if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
    pcVar13 = "NULL";
  }
  else {
    pcVar13 = window->NavLastChildNavWindow->Name;
  }
  BulletText("NavLastChildNavWindow: %s",pcVar13);
  fVar1 = window->NavRectRel[0].Min.x;
  fVar2 = window->NavRectRel[0].Max.x;
  if (fVar1 <= fVar2) {
    fVar3 = window->NavRectRel[0].Min.y;
    fVar4 = window->NavRectRel[0].Max.y;
    if (fVar3 <= fVar4) {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar1,(double)fVar3,(double)fVar2,
                 (double)fVar4);
      goto LAB_001211a5;
    }
  }
  BulletText("NavRectRel[0]: <None>");
LAB_001211a5:
  if (window->RootWindow != window) {
    DebugNodeWindow(window->RootWindow,"RootWindow");
  }
  if (window->ParentWindow != (ImGuiWindow *)0x0) {
    DebugNodeWindow(window->ParentWindow,"ParentWindow");
  }
  if (0 < (window->DC).ChildWindows.Size) {
    DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
  }
  if ((0 < (window->ColumnsStorage).Size) &&
     (bVar9 = TreeNode("Columns","Columns sets (%d)"), bVar9)) {
    lVar19 = 0;
    for (lVar21 = 0; lVar21 < (window->ColumnsStorage).Size; lVar21 = lVar21 + 1) {
      DebugNodeColumns((ImGuiOldColumns *)((long)&((window->ColumnsStorage).Data)->ID + lVar19));
      lVar19 = lVar19 + 0x88;
    }
    TreePop();
  }
  DebugNodeStorage(&window->StateStorage,"Storage");
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
    BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (!window->NavRectRel[0].IsInverted())
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
    else
        BulletText("NavRectRel[0]: <None>");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}